

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O3

void __thiscall
chrono::ChBodyAuxRef::ChBodyAuxRef(ChBodyAuxRef *this,void **vtt,ChBodyAuxRef *other)

{
  _func_int **pp_Var1;
  ChVector<double> local_68;
  ChQuaternion<double> local_50;
  
  ChBody::ChBody(&this->super_ChBody,vtt + 1,&other->super_ChBody);
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj = pp_Var1;
  (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
  _vptr_ChFrame = (_func_int **)0xb056f0;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChContactable._vptr_ChContactable =
       (_func_int **)0xb05788;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x458);
  (this->super_ChBody).super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 6);
  *(void **)(pp_Var1[-3] + -0x78 +
            (long)(&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                    super_ChFrame<double>.coord + -1) + 0x30) = vtt[7];
  local_50.m_data[0] = 1.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->auxref_to_cog,&local_68,&local_50);
  local_68.m_data[2] = 0.0;
  local_50.m_data[0] = 1.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->auxref_to_abs,&local_68,&local_50);
  ChFrameMoving<double>::operator=(&this->auxref_to_cog,&other->auxref_to_cog);
  ChFrameMoving<double>::operator=(&this->auxref_to_abs,&other->auxref_to_abs);
  return;
}

Assistant:

ChBodyAuxRef::ChBodyAuxRef(const ChBodyAuxRef& other) : ChBody(other) {
    auxref_to_cog = other.auxref_to_cog;
    auxref_to_abs = other.auxref_to_abs;
}